

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

void duckdb_brotli::BrotliOptimizeHistograms(uint32_t num_distance_codes,MetaBlockSplit *mb)

{
  ulong uVar1;
  long lVar2;
  uint8_t good_for_rle [704];
  uint8_t auStack_2f8 [712];
  
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < mb->literal_histograms_size; uVar1 = uVar1 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (0x100,(uint32_t *)((long)mb->literal_histograms->data_ + lVar2),auStack_2f8);
    lVar2 = lVar2 + 0x410;
  }
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < mb->command_histograms_size; uVar1 = uVar1 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (0x2c0,(uint32_t *)((long)mb->command_histograms->data_ + lVar2),auStack_2f8);
    lVar2 = lVar2 + 0xb10;
  }
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < mb->distance_histograms_size; uVar1 = uVar1 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              ((ulong)num_distance_codes,(uint32_t *)((long)mb->distance_histograms->data_ + lVar2),
               auStack_2f8);
    lVar2 = lVar2 + 0x890;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliOptimizeHistograms(uint32_t num_distance_codes,
                              MetaBlockSplit* mb) {
  uint8_t good_for_rle[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t i;
  for (i = 0; i < mb->literal_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(256, mb->literal_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->command_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(BROTLI_NUM_COMMAND_SYMBOLS,
                                      mb->command_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->distance_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(num_distance_codes,
                                      mb->distance_histograms[i].data_,
                                      good_for_rle);
  }
}